

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  FileOptions *pFVar5;
  long lVar6;
  
  iVar3 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  bVar2 = 0 < iVar3;
  if (iVar3 < 1) {
LAB_001e7793:
    iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    bVar2 = 0 < iVar3;
    if (0 < iVar3) {
      cVar1 = (**(code **)(**(this->enum_type_).super_RepeatedPtrFieldBase.elements_ + 0x28))();
      if (cVar1 != '\0') {
        lVar6 = 1;
        do {
          lVar4 = (long)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
          bVar2 = lVar6 < lVar4;
          if (lVar4 <= lVar6) goto LAB_001e77df;
          cVar1 = (**(code **)(*(this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar6] +
                              0x28))();
          lVar6 = lVar6 + 1;
        } while (cVar1 != '\0');
      }
      if (bVar2) goto LAB_001e78bc;
    }
LAB_001e77df:
    iVar3 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
    bVar2 = 0 < iVar3;
    if (0 < iVar3) {
      cVar1 = (**(code **)(**(this->service_).super_RepeatedPtrFieldBase.elements_ + 0x28))();
      if (cVar1 != '\0') {
        lVar6 = 1;
        do {
          lVar4 = (long)(this->service_).super_RepeatedPtrFieldBase.current_size_;
          bVar2 = lVar6 < lVar4;
          if (lVar4 <= lVar6) goto LAB_001e7837;
          cVar1 = (**(code **)(*(this->service_).super_RepeatedPtrFieldBase.elements_[lVar6] + 0x28)
                  )();
          lVar6 = lVar6 + 1;
        } while (cVar1 != '\0');
      }
      if (bVar2) goto LAB_001e78bc;
    }
LAB_001e7837:
    iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
    bVar2 = 0 < iVar3;
    if (0 < iVar3) {
      cVar1 = (**(code **)(**(this->extension_).super_RepeatedPtrFieldBase.elements_ + 0x28))();
      if (cVar1 != '\0') {
        lVar6 = 1;
        do {
          lVar4 = (long)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
          bVar2 = lVar6 < lVar4;
          if (lVar4 <= lVar6) goto LAB_001e788b;
          cVar1 = (**(code **)(*(this->extension_).super_RepeatedPtrFieldBase.elements_[lVar6] +
                              0x28))();
          lVar6 = lVar6 + 1;
        } while (cVar1 != '\0');
      }
      if (bVar2) goto LAB_001e78bc;
    }
LAB_001e788b:
    if ((this->_has_bits_[0] & 0x200) != 0) {
      pFVar5 = this->options_;
      if (pFVar5 == (FileOptions *)0x0) {
        pFVar5 = *(FileOptions **)(default_instance_ + 0xb8);
      }
      iVar3 = (*(pFVar5->super_Message).super_MessageLite._vptr_MessageLite[5])();
      if ((char)iVar3 == '\0') goto LAB_001e78bc;
    }
    bVar2 = true;
  }
  else {
    cVar1 = (**(code **)(**(this->message_type_).super_RepeatedPtrFieldBase.elements_ + 0x28))();
    if (cVar1 != '\0') {
      lVar6 = 1;
      do {
        lVar4 = (long)(this->message_type_).super_RepeatedPtrFieldBase.current_size_;
        bVar2 = lVar6 < lVar4;
        if (lVar4 <= lVar6) goto LAB_001e7793;
        cVar1 = (**(code **)(*(this->message_type_).super_RepeatedPtrFieldBase.elements_[lVar6] +
                            0x28))();
        lVar6 = lVar6 + 1;
      } while (cVar1 != '\0');
    }
    if (!bVar2) goto LAB_001e7793;
LAB_001e78bc:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {

  for (int i = 0; i < message_type_size(); i++) {
    if (!this->message_type(i).IsInitialized()) return false;
  }
  for (int i = 0; i < enum_type_size(); i++) {
    if (!this->enum_type(i).IsInitialized()) return false;
  }
  for (int i = 0; i < service_size(); i++) {
    if (!this->service(i).IsInitialized()) return false;
  }
  for (int i = 0; i < extension_size(); i++) {
    if (!this->extension(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}